

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::AddKel
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  TPZFileEqnStorage<double> *this_00;
  TPZFrontSym<double> *this_01;
  DecomposeType DVar1;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<double> AuxEqn;
  long local_32c8;
  int64_t local_32c0;
  TPZEqnArray<double> local_32b8;
  
  this_01 = &this->fFront;
  TPZFrontSym<double>::AddKel(this_01,elmat,sourceindex,destinationindex);
  EquationsToDecompose(this,destinationindex,&local_32c0,&local_32c8);
  TPZEqnArray<double>::TPZEqnArray(&local_32b8);
  if (local_32c0 <= local_32c8) {
    TPZFrontSym<double>::DecomposeEquations(this_01,local_32c0,local_32c8,&local_32b8);
    CheckCompress(this);
    this_00 = &this->fStorage;
    TPZFileEqnStorage<double>::AddEqnArray(this_00,&local_32b8);
    if (local_32c8 ==
        (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        fRow + -1) {
      TPZFrontSym<double>::Reset(this_01,0);
      TPZFileEqnStorage<double>::FinishWriting(this_00);
      TPZFileEqnStorage<double>::ReOpen(this_00);
    }
  }
  DVar1 = TPZFrontSym<double>::GetDecomposeType(this_01);
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDecomposed = (char)DVar1;
  TPZEqnArray<double>::~TPZEqnArray(&local_32b8);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fFront.Reset(0);
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}